

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_unittest.cpp
# Opt level: O0

void __thiscall Array_is_array_Test::~Array_is_array_Test(Array_is_array_Test *this)

{
  Array_is_array_Test *this_local;
  
  ~Array_is_array_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Array, is_array) {
    using namespace memory;

    typedef Array<double, HostCoordinator<double> > by_value;
    typedef ArrayView<double, HostCoordinator<double> > by_view;

    static_assert(
        impl::is_array_by_value<by_value>::value,
        "is_array_by_value incorrectly returned false for array_by_value" );

    static_assert(
        !impl::is_array_view<by_value>::value,
        "is_array_view incorrectly returned true for array_by_value" );

    static_assert(
        !impl::is_array_by_value<by_view>::value,
        "is_array_by_value incorrectly returned true for array_view" );

    static_assert(
        impl::is_array_view<by_view>::value,
        "is_array_view incorrectly returned false for array_view" );

    static_assert(
        impl::is_array<by_value>::value,
        "is_array incorrectly returned false for array_by_value" );

    static_assert(
        impl::is_array<by_view>::value,
        "is_array incorrectly returned false for array_view" );

    static_assert(
        !impl::is_array_by_value<int>::value,
        "is_array_by_value returns true for type other than array_by_value" );

    static_assert(
        !impl::is_array_view<int>::value,
        "is_array_view returns true for type other than array_by_value" );
}